

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

size_t quicly_send_stateless_reset(quicly_context_t *ctx,void *src_cid,void *payload)

{
  int iVar1;
  
  (*ctx->tls->random_bytes)(payload,0x17);
  *(byte *)payload = *payload & 0x3f | 0x40;
  iVar1 = (*ctx->cid_encryptor->generate_stateless_reset_token)
                    (ctx->cid_encryptor,(void *)((long)payload + 0x17),src_cid);
  return -(ulong)(iVar1 == 0) | 0x27;
}

Assistant:

size_t quicly_send_stateless_reset(quicly_context_t *ctx, const void *src_cid, void *payload)
{
    uint8_t *base = payload;

    /* build stateless reset packet */
    ctx->tls->random_bytes(base, QUICLY_STATELESS_RESET_PACKET_MIN_LEN - QUICLY_STATELESS_RESET_TOKEN_LEN);
    base[0] = (base[0] & ~QUICLY_LONG_HEADER_BIT) | QUICLY_QUIC_BIT;
    if (!ctx->cid_encryptor->generate_stateless_reset_token(
            ctx->cid_encryptor, base + QUICLY_STATELESS_RESET_PACKET_MIN_LEN - QUICLY_STATELESS_RESET_TOKEN_LEN, src_cid))
        return SIZE_MAX;

    return QUICLY_STATELESS_RESET_PACKET_MIN_LEN;
}